

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::
         write_significand<char,fmt::v8::appender,unsigned_int,fmt::v8::detail::digit_grouping<char>>
                   (appender out,uint significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar1;
  appender out_00;
  format_decimal_result<char_*> fVar2;
  undefined **local_250;
  char buffer [10];
  undefined1 local_230 [510];
  char local_32 [8];
  char buffer_1 [10];
  
  if ((grouping->sep_).thousands_sep == '\0') {
    fVar2 = format_decimal<char,unsigned_int>((char *)&local_250,significand,significand_size);
    out_00 = copy_str_noinline<char,char*,fmt::v8::appender>((char *)&local_250,fVar2.end,out);
    local_250 = (undefined **)CONCAT71(local_250._1_7_,0x30);
    bVar1.container =
         (buffer<char> *)fill_n<fmt::v8::appender,int,char>(out_00,exponent,(char *)&local_250);
  }
  else {
    stack0xfffffffffffffdc0 = 0;
    local_250 = &PTR_grow_001c61f0;
    buffer._0_8_ = local_230;
    fVar2 = format_decimal<char,unsigned_int>(local_32,significand,significand_size);
    copy_str_noinline<char,char*,fmt::v8::appender>(local_32,fVar2.end,(appender)&local_250);
    local_32[0] = '0';
    fill_n<fmt::v8::appender,int,char>((appender)&local_250,exponent,local_32);
    digits.size_ = stack0xfffffffffffffdc0;
    digits.data_ = (char *)buffer._0_8_;
    bVar1.container =
         (buffer<char> *)digit_grouping<char>::apply<fmt::v8::appender,char>(grouping,out,digits);
    if ((undefined1 *)buffer._0_8_ != local_230) {
      operator_delete((void *)buffer._0_8_);
    }
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}